

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_convolve_x_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  uint16_t uVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t res;
  int x;
  int y;
  int bits;
  int val;
  undefined4 local_2c;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < in_R9D; local_2c = local_2c + 1) {
    for (val = 0; val < in_R8D; val = val + 1) {
      uVar1 = clip_pixel_highbd(val,(int)(((uint)*(ushort *)(local_8 + (long)val * 2) +
                                          (uint)*(ushort *)(local_8 + (long)(val + 1) * 2)) * 0x40 +
                                         ((1 << ((byte)*(undefined4 *)
                                                        (CONCAT44(dst_stride,w) + 0x14) & 0x1f)) >>
                                         1)) >>
                                    ((byte)*(undefined4 *)(CONCAT44(dst_stride,w) + 0x14) & 0x1f));
      *(uint16_t *)(local_18 + (long)val * 2) = uVar1;
    }
    local_8 = local_8 + (long)in_ESI * 2;
    local_18 = local_18 + (long)in_ECX * 2;
  }
  return;
}

Assistant:

void av1_highbd_convolve_x_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x, const int subpel_x_qn,
    ConvolveParams *conv_params, int bd) {
  const int bits = FILTER_BITS - conv_params->round_0;
  assert(bits >= 0);
  assert(subpel_x_qn == 8);
  assert(filter_params_x->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 64 * (src[x] + src[x + 1]);
      res = ROUND_POWER_OF_TWO(res, conv_params->round_0);
      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
    src += src_stride;
    dst += dst_stride;
  }
}